

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayGenerateMipMap.cpp
# Opt level: O1

int __thiscall
glcts::TextureCubeMapArrayGenerateMipMapFilterable::init
          (TextureCubeMapArrayGenerateMipMapFilterable *this,EVP_PKEY_CTX *ctx)

{
  NotSupportedError *this_00;
  int iVar1;
  string local_40;
  
  iVar1 = TestCaseBase::init(&this->super_TestCaseBase,ctx);
  if ((this->super_TestCaseBase).m_is_texture_cube_map_array_supported != false) {
    return iVar1;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Texture cube map array functionality not supported, skipping","");
  tcu::NotSupportedError::NotSupportedError(this_00,&local_40);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureCubeMapArrayGenerateMipMapFilterable::init()
{
	/* Base class initialization */
	TestCaseBase::init();

	/* Check if texture_cube_map_array extension is supported */
	if (!m_is_texture_cube_map_array_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_CUBE_MAP_ARRAY_EXTENSION_NOT_SUPPORTED);
	}
}